

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O1

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddCylinder
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,double rx,
          double rz,double hy,ChVector<double> *pos,ChMatrix33<double> *rot)

{
  undefined1 auVar1 [16];
  ChCollisionShapeBullet *this_00;
  cbtCollisionShape *this_01;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  undefined8 in_XMM0_Qb;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  shared_ptr<chrono::ChMaterialSurface> local_48;
  cbtVector3 local_38;
  
  dVar5 = rx;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x23])();
  auVar6._0_8_ = (double)SUB84(dVar5,0);
  auVar6._8_8_ = in_XMM0_Qb;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = rx;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = rz;
  auVar1 = vminsd_avx(auVar7,auVar1);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = hy * 0.5;
  auVar1 = vminsd_avx(auVar1,auVar9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = auVar1._0_8_ * 0.2;
  auVar1 = vminsd_avx(auVar6,auVar8);
  fVar2 = auVar1._0_4_;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])(this);
  this_00 = (ChCollisionShapeBullet *)::operator_new(0x28);
  local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChCollisionShapeBullet::ChCollisionShapeBullet(this_00,CYLINDER,&local_48);
  if (local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  fVar3 = (float)((double)fVar2 + rx);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  fVar4 = (float)((double)fVar3 + rz);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  this_01 = (cbtCollisionShape *)cbtAlignedAllocInternal(0x48,0x10);
  local_38.m_floats[3] = 0.0;
  local_38.m_floats[0] = (float)((double)fVar2 + rx);
  local_38.m_floats[1] = (float)((double)fVar4 + hy);
  local_38.m_floats[2] = (float)((double)fVar3 + rz);
  cbtCylinderShape::cbtCylinderShape((cbtCylinderShape *)this_01,&local_38);
  this_00->m_bt_shape = this_01;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
  (*this_01->_vptr_cbtCollisionShape[0xb])(this_01);
  injectShape(this,pos,rot,this_00);
  return true;
}

Assistant:

bool ChCollisionModelBullet::AddCylinder(std::shared_ptr<ChMaterialSurface> material,
                                         double rx,
                                         double rz,
                                         double hy,
                                         const ChVector<>& pos,
                                         const ChMatrix33<>& rot) {
    // adjust default inward margin (if object too thin)
    SetSafeMargin(ChMin(GetSafeMargin(), 0.2 * ChMin(ChMin(rx, rz), 0.5 * hy)));

    auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::CYLINDER, material);

    cbtScalar arx = (cbtScalar)(rx + GetEnvelope());
    cbtScalar arz = (cbtScalar)(rz + GetEnvelope());
    cbtScalar ahy = (cbtScalar)(hy + GetEnvelope());
    shape->m_bt_shape = new cbtCylinderShape(cbtVector3(arx, ahy, arz));
    shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());

    injectShape(pos, rot, shape);
    return true;
}